

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

char * __thiscall
kj::_::Delimited<kj::ArrayPtr<int>_&>::flattenTo
          (Delimited<kj::ArrayPtr<int>_&> *this,char *target,char *limit)

{
  int *piVar1;
  size_t sVar2;
  bool bVar3;
  long lVar4;
  char *pcVar5;
  int *elem;
  int *piVar6;
  CappedArray<char,_14UL> local_48;
  
  sVar2 = this->array->size_;
  if (sVar2 != 0) {
    piVar6 = this->array->ptr;
    piVar1 = piVar6 + sVar2;
    bVar3 = true;
    do {
      if (target == limit) {
        return target;
      }
      if (!bVar3) {
        pcVar5 = (this->delimiter).content.ptr;
        sVar2 = (this->delimiter).content.size_;
        if (pcVar5 != pcVar5 + (sVar2 - 1)) {
          lVar4 = 1;
          do {
            *target = pcVar5[lVar4 + -1];
            target = target + 1;
            if ((2 - sVar2) + lVar4 == 1) break;
            lVar4 = lVar4 + 1;
          } while (target != limit);
        }
      }
      Stringifier::operator*(&local_48,(Stringifier *)&_::STR,*piVar6);
      if (target != limit && local_48.currentSize != 0) {
        pcVar5 = (char *)(local_48.currentSize - 1);
        if (limit + ~(ulong)target < (char *)(local_48.currentSize - 1)) {
          pcVar5 = limit + ~(ulong)target;
        }
        memcpy(target,local_48.content,(size_t)(pcVar5 + 1));
        target = target + (long)pcVar5 + 1;
      }
      piVar6 = piVar6 + 1;
      bVar3 = false;
    } while (piVar6 != piVar1);
  }
  return target;
}

Assistant:

char* flattenTo(char* __restrict__ target, char* limit) {
    // This is called in the strPreallocated(). We want to avoid allocation. size() will not have
    // been called in this case, so hopefully `stringified` is still uninitialized. We will
    // stringify each item and immediately use it.
    bool first = true;
    for (auto&& elem: array) {
      if (target == limit) return target;
      if (first) {
        first = false;
      } else {
        target = fillLimited(target, limit, delimiter);
      }
      target = fillLimited(target, limit, kj::toCharSequence(elem));
    }
    return target;
  }